

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::place(QMdiAreaPrivate *this,Placer *placer,QMdiSubWindow *child)

{
  bool bVar1;
  int iVar2;
  QRect *pQVar3;
  QWidget *in_RDX;
  undefined8 *in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *window;
  add_const_t<QList<QPointer<QMdiSubWindow>_>_> *__range1;
  QMdiArea *q;
  QRect newGeometry;
  QPoint newPos;
  QRect occupiedGeometry;
  const_iterator __end1;
  const_iterator __begin1;
  QRect parentRect;
  QList<QRect> rects;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QRect *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  QWidget *in_stack_fffffffffffffef8;
  QRect *in_stack_ffffffffffffff00;
  LayoutDirection direction;
  QWidget *in_stack_ffffffffffffff10;
  QWidget *this_00;
  qsizetype local_c0;
  QSize local_a0;
  undefined1 *local_98;
  QRect local_90;
  QPoint local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QPointer<QMdiSubWindow> *local_58;
  const_iterator local_50;
  const_iterator local_48;
  undefined1 local_40 [16];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI != (undefined8 *)0x0) && (in_RDX != (QWidget *)0x0)) {
    q_func(in_RDI);
    bVar1 = QWidget::isVisible((QWidget *)0x60f593);
    if (bVar1) {
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QRect>::QList((QList<QRect> *)0x60f617);
      QList<QPointer<QMdiSubWindow>_>::size(&in_RDI->childWindows);
      QList<QRect>::reserve((QList<QRect> *)in_RDI,local_c0);
      local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = (undefined1  [16])QWidget::rect(in_stack_fffffffffffffef8);
      this_00 = (QWidget *)&in_RDI->childWindows;
      local_48.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = QList<QPointer<QMdiSubWindow>_>::begin
                           ((QList<QPointer<QMdiSubWindow>_> *)in_stack_fffffffffffffee0);
      local_50.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
      local_50 = QList<QPointer<QMdiSubWindow>_>::end
                           ((QList<QPointer<QMdiSubWindow>_> *)in_stack_fffffffffffffee0);
      while( true ) {
        local_58 = local_50.i;
        bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_48,local_50);
        direction = (LayoutDirection)((ulong)in_RDI >> 0x20);
        if (!bVar1) break;
        QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_48);
        in_stack_ffffffffffffff10 =
             &::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x60f717)->
              super_QWidget;
        bVar1 = sanityCheck((QMdiSubWindow *)in_stack_fffffffffffffee0,
                            (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        if ((((bVar1) && (in_stack_ffffffffffffff10 != in_RDX)) &&
            (bVar1 = QWidget::isVisibleTo
                               (in_stack_fffffffffffffef8,
                                (QWidget *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)),
            bVar1)) &&
           (bVar1 = QWidget::testAttribute
                              ((QWidget *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                               (WidgetAttribute)((ulong)in_stack_fffffffffffffee0 >> 0x20)), bVar1))
        {
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          QRect::QRect(in_stack_fffffffffffffee0);
          bVar1 = QWidget::isMaximized(in_stack_ffffffffffffff10);
          if (bVar1) {
            QMdiSubWindow::d_func((QMdiSubWindow *)0x60f7b1);
            local_80 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffedc,
                                                        in_stack_fffffffffffffed8));
            QMdiSubWindow::d_func((QMdiSubWindow *)0x60f7d2);
            QRect::QRect(in_stack_ffffffffffffff00,(QPoint *)in_stack_fffffffffffffef8,
                         (QSize *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            local_68 = (undefined1 *)local_78;
            local_60 = (undefined1 *)local_70;
          }
          else {
            pQVar3 = QWidget::geometry(in_stack_ffffffffffffff10);
            local_68._0_4_ = pQVar3->x1;
            local_68._4_4_ = pQVar3->y1;
            local_60._0_4_ = pQVar3->x2;
            local_60._4_4_ = pQVar3->y2;
          }
          QWidget::layoutDirection((QWidget *)0x60f83e);
          local_90 = QStyle::visualRect((LayoutDirection)((ulong)in_RDI >> 0x20),
                                        in_stack_ffffffffffffff00,(QRect *)in_stack_fffffffffffffef8
                                       );
          QList<QRect>::append
                    ((QList<QRect> *)in_stack_fffffffffffffee0,
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        }
        QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_48);
      }
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = QWidget::size((QWidget *)
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_98 = (undefined1 *)(**(code **)*in_RSI)(in_RSI,&local_a0,&local_30,local_40);
      iVar2 = QPoint::x((QPoint *)0x60f909);
      QPoint::y((QPoint *)0x60f91a);
      QWidget::width((QWidget *)0x60f928);
      QWidget::height((QWidget *)0x60f936);
      QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_fffffffffffffee8),(int)((ulong)in_RSI >> 0x20),
                   (int)in_RSI,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
      QWidget::layoutDirection((QWidget *)0x60f963);
      QStyle::visualRect(direction,in_stack_ffffffffffffff00,(QRect *)in_RDX);
      QWidget::setGeometry(this_00,(QRect *)in_stack_ffffffffffffff10);
      QList<QRect>::~QList((QList<QRect> *)0x60f99d);
    }
    else {
      QPointer<QMdiSubWindow>::QPointer<void>
                ((QPointer<QMdiSubWindow> *)in_stack_fffffffffffffee0,
                 (QMdiSubWindow *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QList<QPointer<QMdiSubWindow>_>::append
                ((QList<QPointer<QMdiSubWindow>_> *)in_stack_fffffffffffffee0,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QPointer<QMdiSubWindow>::~QPointer((QPointer<QMdiSubWindow> *)0x60f5d8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::place(Placer *placer, QMdiSubWindow *child)
{
    if (!placer || !child)
        return;

    Q_Q(QMdiArea);
    if (!q->isVisible()) {
        // The window is only laid out when it's added to QMdiArea,
        // so there's no need to check that we don't have it in the
        // list already. appendChild() ensures that.
        pendingPlacements.append(child);
        return;
    }

    QList<QRect> rects;
    rects.reserve(childWindows.size());
    QRect parentRect = q->rect();
    for (QMdiSubWindow *window : std::as_const(childWindows)) {
        if (!sanityCheck(window, "QMdiArea::place") || window == child || !window->isVisibleTo(q)
                || !window->testAttribute(Qt::WA_Moved)) {
            continue;
        }
        QRect occupiedGeometry;
        if (window->isMaximized()) {
            occupiedGeometry = QRect(window->d_func()->oldGeometry.topLeft(),
                                     window->d_func()->restoreSize);
        } else {
            occupiedGeometry = window->geometry();
        }
        rects.append(QStyle::visualRect(child->layoutDirection(), parentRect, occupiedGeometry));
    }
    QPoint newPos = placer->place(child->size(), rects, parentRect);
    QRect newGeometry = QRect(newPos.x(), newPos.y(), child->width(), child->height());
    child->setGeometry(QStyle::visualRect(child->layoutDirection(), parentRect, newGeometry));
}